

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

void __thiscall
chaiscript::exception::file_not_found_error::file_not_found_error
          (file_not_found_error *this,string *t_filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::operator+(&local_28,"File Not Found: ",t_filename);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_00322388;
  return;
}

Assistant:

file_not_found_error(const std::string &t_filename) CHAISCRIPT_NOEXCEPT
        : std::runtime_error("File Not Found: " + t_filename)
      { }